

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O3

ParseResult * __thiscall
trivialre::re_compiler::C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy>
::ParseAlt(ParseResult *__return_storage_ptr__,
          C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy> *this,
          string_view str)

{
  undefined8 uVar1;
  undefined8 uVar2;
  string_view str_00;
  undefined8 local_148;
  undefined8 uStack_140;
  long local_138;
  _Invoker_type p_Stack_130;
  undefined1 local_128 [24];
  code *pcStack_110;
  bool local_108;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  _Any_data local_e8;
  _Manager_type local_d8;
  _Invoker_type local_d0;
  _Any_data local_c8;
  _Manager_type local_b8;
  _Invoker_type local_b0;
  undefined1 local_a8 [24];
  code *pcStack_90;
  bool local_88;
  size_t local_80;
  char *pcStack_78;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  
  ParseRun((ParseResult *)local_a8,this,str);
  if ((local_80 == 0) || (*pcStack_78 != '|')) {
    (__return_storage_ptr__->first).
    super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
    .
    super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
    ._M_engaged = false;
    if (local_88 == true) {
      *(undefined8 *)
       &(__return_storage_ptr__->first).
        super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
        .
        super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
        ._M_payload = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->first).
               super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
               .
               super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
               ._M_payload + 8) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->first).
               super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
               .
               super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
               ._M_payload + 0x10) = 0;
      (__return_storage_ptr__->first).
      super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
      .
      super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ._M_payload._M_value._M_invoker = pcStack_90;
      if ((_Manager_type)local_a8._16_8_ != (_Manager_type)0x0) {
        *(undefined8 *)
         &(__return_storage_ptr__->first).
          super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
          .
          super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
          ._M_payload = local_a8._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->first).
                 super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                 ._M_payload + 8) = local_a8._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->first).
                 super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                 ._M_payload + 0x10) = local_a8._16_8_;
        local_a8._16_8_ = (_Manager_type)0x0;
        pcStack_90 = (_Invoker_type)0x0;
      }
      (__return_storage_ptr__->first).
      super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
      .
      super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ._M_engaged = true;
    }
    (__return_storage_ptr__->second)._M_len = local_80;
    (__return_storage_ptr__->second)._M_str = pcStack_78;
  }
  else {
    if (local_88 != true) {
      std::
      _Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ::_M_reset((_Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                  *)local_a8);
      pcStack_90 = std::
                   _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:110:12)>
                   ::_M_invoke;
      local_a8._0_8_ = 0;
      local_a8._8_8_ = 0;
      local_a8._16_8_ =
           std::
           _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:110:12)>
           ::_M_manager;
      local_88 = true;
      if (local_80 == 0) {
        uVar2 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",1,0);
        __clang_call_terminate(uVar2);
      }
    }
    str_00._M_len = local_80 - 1;
    str_00._M_str = pcStack_78 + 1;
    ParseAlt((ParseResult *)local_128,this,str_00);
    if (local_108 == false) {
      std::
      _Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ::_M_reset((_Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                  *)local_128);
      pcStack_110 = std::
                    _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:110:12)>
                    ::_M_invoke;
      local_128._0_8_ = 0;
      local_128._8_8_ = 0;
      local_128._16_8_ =
           std::
           _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:110:12)>
           ::_M_manager;
      local_108 = true;
    }
    local_d0 = pcStack_90;
    uVar1 = local_a8._16_8_;
    local_b0 = pcStack_110;
    uVar2 = local_128._16_8_;
    if (local_88 == false) {
      std::__throw_bad_optional_access();
    }
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_58 = (_Manager_type)0x0;
    p_Stack_50 = pcStack_90;
    if ((_Manager_type)local_a8._16_8_ != (_Manager_type)0x0) {
      local_68._M_unused._M_object = (void *)local_a8._0_8_;
      local_68._8_8_ = local_a8._8_8_;
      local_58 = (_Manager_type)local_a8._16_8_;
      local_a8._16_8_ = (_Manager_type)0x0;
      pcStack_90 = (_Invoker_type)0x0;
    }
    if (local_108 == false) {
      std::__throw_bad_optional_access();
    }
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_38 = (_Manager_type)0x0;
    p_Stack_30 = pcStack_110;
    if ((_Manager_type)local_128._16_8_ != (_Manager_type)0x0) {
      local_48._M_unused._M_object = (void *)local_128._0_8_;
      local_48._8_8_ = local_128._8_8_;
      local_38 = (_Manager_type)local_128._16_8_;
      local_128._16_8_ = (_Manager_type)0x0;
      pcStack_110 = (_Invoker_type)0x0;
    }
    local_e8._M_unused._M_object = (void *)0x0;
    local_e8._8_8_ = 0;
    local_d8 = (_Manager_type)0x0;
    if ((_Manager_type)uVar1 != (_Manager_type)0x0) {
      local_e8._M_unused._M_object = local_68._M_unused._M_object;
      local_e8._8_8_ = local_68._8_8_;
      local_d8 = (_Manager_type)uVar1;
      local_58 = (_Manager_type)0x0;
      p_Stack_50 = (_Invoker_type)0x0;
    }
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    local_b8 = (_Manager_type)0x0;
    if ((_Manager_type)uVar2 != (_Manager_type)0x0) {
      local_c8._M_unused._M_object = local_48._M_unused._M_object;
      local_c8._8_8_ = local_48._8_8_;
      local_b8 = (_Manager_type)uVar2;
      local_38 = (_Manager_type)0x0;
      p_Stack_30 = (_Invoker_type)0x0;
    }
    std::
    function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>
    ::
    function<trivialre::matchers::MatcherBuilder::Alt(std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>)::_lambda(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)_1_,void>
              ((function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>
                *)&local_148,(anon_class_64_2_208f5e76 *)&local_e8);
    if (local_b8 != (_Manager_type)0x0) {
      (*local_b8)(&local_c8,&local_c8,__destroy_functor);
    }
    if (local_d8 != (_Manager_type)0x0) {
      (*local_d8)(&local_e8,&local_e8,__destroy_functor);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->first).
      super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
      .
      super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ._M_payload = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->first).
             super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
             .
             super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
             ._M_payload + 8) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->first).
             super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
             .
             super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
             ._M_payload + 0x10) = 0;
    (__return_storage_ptr__->first).
    super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
    .
    super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
    ._M_payload._M_value._M_invoker = p_Stack_130;
    if (local_138 != 0) {
      *(undefined8 *)
       &(__return_storage_ptr__->first).
        super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
        .
        super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
        ._M_payload = local_148;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->first).
               super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
               .
               super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
               ._M_payload + 8) = uStack_140;
      *(long *)((long)&(__return_storage_ptr__->first).
                       super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                       ._M_payload + 0x10) = local_138;
      local_138 = 0;
      p_Stack_130 = (_Invoker_type)0x0;
    }
    *(undefined4 *)&(__return_storage_ptr__->second)._M_len = local_100;
    *(undefined4 *)((long)&(__return_storage_ptr__->second)._M_len + 4) = uStack_fc;
    *(undefined4 *)&(__return_storage_ptr__->second)._M_str = uStack_f8;
    *(undefined4 *)((long)&(__return_storage_ptr__->second)._M_str + 4) = uStack_f4;
    (__return_storage_ptr__->first).
    super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
    .
    super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
    ._M_engaged = true;
    if (local_38 != (_Manager_type)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (local_58 != (_Manager_type)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    std::
    _Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
    ::_M_reset((_Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                *)local_128);
  }
  std::
  _Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
  ::_M_reset((_Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
              *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

ParseResult ParseAlt(std::string_view str) {
    auto [maybe_left, str_l] = ParseRun(str);
    if (IsCharAt(str_l, 0, '|')) {
      if (!maybe_left) {
        maybe_left.emplace(builder.Any());
      }
      auto [maybe_right, str_r] = ParseAlt(str_l.substr(1));
      if (!maybe_right) {
        maybe_right.emplace(builder.Any());
      }
      return {builder.Alt(std::move(maybe_left.value()), std::move(maybe_right.value())), str_r};
    }
    return {std::move(maybe_left), str_l};
  }